

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

HelicsTime helicsFederateRequestTime(HelicsFederate fed,HelicsTime requestTime,HelicsError *err)

{
  Federate *this;
  FedObject *pFVar1;
  Time TVar2;
  HelicsTime local_20;
  
  pFVar1 = helics::getFedObject(fed,err);
  local_20 = -1.785e+39;
  if ((pFVar1 != (FedObject *)0x0) &&
     (this = (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, this != (Federate *)0x0)) {
    if (requestTime <= -9223372036.854765) {
      TVar2.internalTimeCode = -0x7fffffffffffffff;
    }
    else {
      TVar2.internalTimeCode = 0x7fffffffffffffff;
      if (requestTime < 9223372036.854765) {
        TVar2.internalTimeCode =
             (baseType)
             (requestTime * 1000000000.0 +
             *(double *)(&DAT_004296c0 + (ulong)(0.0 <= requestTime * 1000000000.0) * 8));
      }
    }
    TVar2 = helics::Federate::requestTime(this,TVar2);
    if (TVar2.internalTimeCode == 0x7fffffffffffffff) {
      local_20 = 9223372036.854774;
    }
    else {
      local_20 = (double)(TVar2.internalTimeCode % 1000000000) * 1e-09 +
                 (double)(TVar2.internalTimeCode / 1000000000);
    }
  }
  return local_20;
}

Assistant:

HelicsTime helicsFederateRequestTime(HelicsFederate fed, HelicsTime requestTime, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto timeret = fedObj->requestTime(requestTime);
        return (timeret < helics::Time::maxVal()) ? static_cast<double>(timeret) : HELICS_TIME_MAXTIME;
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
}